

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

void link_destroy(LINK_HANDLE link)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (link != (LINK_HANDLE)0x0) {
    remove_all_pending_deliveries(link,false);
    tickcounter_destroy(link->tick_counter);
    link->on_link_state_changed = (ON_LINK_STATE_CHANGED)0x0;
    link_detach(link,true,(char *)0x0,(char *)0x0,(AMQP_VALUE)0x0);
    session_set_link_endpoint_callback
              (link->link_endpoint,(ON_LINK_ENDPOINT_DESTROYED_CALLBACK)0x0,(void *)0x0);
    session_destroy_link_endpoint(link->link_endpoint);
    amqpvalue_destroy(link->source);
    amqpvalue_destroy(link->target);
    free(link->name);
    if (link->attach_properties != (AMQP_VALUE)0x0) {
      amqpvalue_destroy(link->attach_properties);
    }
    free(link->received_payload);
    free(link);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
               ,"link_destroy",0x38d,1,"NULL link");
    return;
  }
  return;
}

Assistant:

void link_destroy(LINK_HANDLE link)
{
    if (link == NULL)
    {
        LogError("NULL link");
    }
    else
    {
        remove_all_pending_deliveries((LINK_INSTANCE*)link, false);
        tickcounter_destroy(link->tick_counter);

        link->on_link_state_changed = NULL;
        (void)link_detach(link, true, NULL, NULL, NULL);
        // This is required to suppress the link destroyed callback, since this function is 
        // actively requesting that (in the following line).
        session_set_link_endpoint_callback(link->link_endpoint, NULL, NULL);
        session_destroy_link_endpoint(link->link_endpoint);
        amqpvalue_destroy(link->source);
        amqpvalue_destroy(link->target);

        if (link->name != NULL)
        {
            free(link->name);
        }

        if (link->attach_properties != NULL)
        {
            amqpvalue_destroy(link->attach_properties);
        }

        if (link->received_payload != NULL)
        {
            free(link->received_payload);
        }

        free(link);
    }
}